

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tick.cpp
# Opt level: O1

void __thiscall MetaSim::Tick::Tick(Tick *this,string *s)

{
  int iVar1;
  ParseExc *this_00;
  double num;
  string unit;
  double local_70;
  string local_68;
  string local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  parse_util::parse_double(s,&local_70,&local_68);
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if ((((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)&local_68), iVar1 != 0)) &&
      (iVar1 = std::__cxx11::string::compare((char *)&local_68), iVar1 != 0)) &&
     ((iVar1 = std::__cxx11::string::compare((char *)&local_68), iVar1 != 0 &&
      (iVar1 = std::__cxx11::string::compare((char *)&local_68), iVar1 != 0)))) {
    this_00 = (ParseExc *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Cannot understand time unit: ","");
    parse_util::ParseExc::ParseExc(this_00,&local_48,&local_68);
    __cxa_throw(this_00,&parse_util::ParseExc::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar1 == 0) {
    local_70 = (double)default_unit * local_70;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      local_70 = local_70 * 1000000000.0;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar1 == 0) {
        local_70 = local_70 * 1000000.0;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar1 == 0) {
          local_70 = local_70 * 1000.0;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_68);
          if (iVar1 != 0) goto LAB_0015724a;
        }
      }
    }
  }
  this->v = (long)(local_70 / (double)resolution);
LAB_0015724a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

Tick::Tick(const string &s)
    {
        string unit;
        double num;

        parse_double(s, num, unit);

        if (unit != "s" && unit != "ms" && unit != "us" && unit != "ns" && unit != "") 
            throw ParseExc("Cannot understand time unit: ", unit);

        if (unit == "") { v = (impl_t)((num * default_unit) / resolution); }
        else if (unit == "s") { v = (impl_t)((num * 1000000000) / resolution);}
        else if (unit == "ms")  { v = (impl_t)((num * 1000000) / resolution); }
        else if (unit == "us")  { v = (impl_t)((num * 1000) / resolution); }
        else if (unit == "ns")  { v = (impl_t)((num) / resolution); }
    }